

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O1

void __thiscall BamTools::SamProgramChain::Add(SamProgramChain *this,SamProgram *program)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  string local_40;
  
  iVar3 = IndexOf(this,&program->ID);
  pSVar1 = (this->m_data).
           super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->m_data).
           super__Vector_base<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (iVar3 == (int)((ulong)((long)pSVar2 - (long)pSVar1) >> 3) * 0x684bda13) {
    if (pSVar1 != pSVar2) {
      NextIdFor(&local_40,this,&program->ID);
      std::__cxx11::string::_M_assign((string *)&program->NextProgramID);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>::push_back
              (&this->m_data,program);
  }
  return;
}

Assistant:

void SamProgramChain::Add(SamProgram& program)
{

    // ignore duplicated records
    if (Contains(program)) {
        return;
    }

    // if other programs already in chain, try to find the "next" record
    // tries to match another record's PPID with @program's ID
    if (!IsEmpty()) {
        program.NextProgramID = NextIdFor(program.ID);
    }

    // store program record
    m_data.push_back(program);
}